

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

int __thiscall
ON_PlaneSurface::GetNurbForm(ON_PlaneSurface *this,ON_NurbsSurface *nurbs,double tolerance)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  ON_3dPoint local_a0;
  ON_3dPoint local_88;
  ON_3dPoint local_70;
  ON_3dPoint local_58;
  undefined1 local_40 [8];
  ON_3dVector N;
  bool rc;
  double tolerance_local;
  ON_NurbsSurface *nurbs_local;
  ON_PlaneSurface *this_local;
  
  uVar2 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])(this,0);
  N.z._7_1_ = (byte)uVar2 & 1;
  if ((((uVar2 & 1) == 0) &&
      ((dVar3 = (this->m_plane).origin.x, dVar3 != -1.23432101234321e+308 || (NAN(dVar3))))) &&
     (((dVar3 = (this->m_plane).xaxis.x, dVar3 != -1.23432101234321e+308 || (NAN(dVar3))) &&
      ((((dVar3 = (this->m_plane).yaxis.x, dVar3 != -1.23432101234321e+308 || (NAN(dVar3))) &&
        (bVar1 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x90), bVar1)) &&
       (((bVar1 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0xa0), bVar1 &&
         (dVar3 = ON_Interval::Length((ON_Interval *)&this->field_0xb0), 0.0 < dVar3)) &&
        (dVar3 = ON_Interval::Length((ON_Interval *)&this->field_0xc0), 0.0 < dVar3)))))))) {
    ON_CrossProduct((ON_3dVector *)local_40,&(this->m_plane).xaxis,&(this->m_plane).yaxis);
    dVar3 = ON_3dVector::Length((ON_3dVector *)local_40);
    if (dVar3 <= 0.0001) {
      ON_WarningEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_planesurface.cpp"
                   ,0x22e,"","ON_PlaneSurface::GetNurbForm - using invalid surface.");
      N.z._7_1_ = 1;
    }
  }
  if ((N.z._7_1_ & 1) != 0) {
    nurbs->m_dim = 3;
    nurbs->m_is_rat = 0;
    nurbs->m_order[1] = 2;
    nurbs->m_order[0] = 2;
    nurbs->m_cv_count[1] = 2;
    nurbs->m_cv_count[0] = 2;
    nurbs->m_cv_stride[1] = nurbs->m_dim;
    nurbs->m_cv_stride[0] = nurbs->m_cv_stride[1] * nurbs->m_cv_count[1];
    ON_NurbsSurface::ReserveCVCapacity(nurbs,0xc);
    ON_NurbsSurface::ReserveKnotCapacity(nurbs,0,2);
    ON_NurbsSurface::ReserveKnotCapacity(nurbs,1,2);
    dVar3 = ON_Interval::operator[]((ON_Interval *)&this->field_0x90,0);
    *nurbs->m_knot[0] = dVar3;
    dVar3 = ON_Interval::operator[]((ON_Interval *)&this->field_0x90,1);
    nurbs->m_knot[0][1] = dVar3;
    dVar3 = ON_Interval::operator[]((ON_Interval *)&this->field_0xa0,0);
    *nurbs->m_knot[1] = dVar3;
    dVar3 = ON_Interval::operator[]((ON_Interval *)&this->field_0xa0,1);
    nurbs->m_knot[1][1] = dVar3;
    dVar3 = ON_Interval::operator[]((ON_Interval *)&this->field_0x90,0);
    dVar4 = ON_Interval::operator[]((ON_Interval *)&this->field_0xa0,0);
    ON_Surface::PointAt(&local_58,&this->super_ON_Surface,dVar3,dVar4);
    ON_NurbsSurface::SetCV(nurbs,0,0,&local_58);
    dVar3 = ON_Interval::operator[]((ON_Interval *)&this->field_0x90,0);
    dVar4 = ON_Interval::operator[]((ON_Interval *)&this->field_0xa0,1);
    ON_Surface::PointAt(&local_70,&this->super_ON_Surface,dVar3,dVar4);
    ON_NurbsSurface::SetCV(nurbs,0,1,&local_70);
    dVar3 = ON_Interval::operator[]((ON_Interval *)&this->field_0x90,1);
    dVar4 = ON_Interval::operator[]((ON_Interval *)&this->field_0xa0,0);
    ON_Surface::PointAt(&local_88,&this->super_ON_Surface,dVar3,dVar4);
    ON_NurbsSurface::SetCV(nurbs,1,0,&local_88);
    dVar3 = ON_Interval::operator[]((ON_Interval *)&this->field_0x90,1);
    dVar4 = ON_Interval::operator[]((ON_Interval *)&this->field_0xa0,1);
    ON_Surface::PointAt(&local_a0,&this->super_ON_Surface,dVar3,dVar4);
    ON_NurbsSurface::SetCV(nurbs,1,1,&local_a0);
  }
  return (int)(N.z._7_1_ & 1);
}

Assistant:

int ON_PlaneSurface::GetNurbForm( // returns 0: unable to create NURBS representation
                   //            with desired accuracy.
                   //         1: success - returned NURBS parameterization
                   //            matches the surface's to the desired accuracy
                   //         2: success - returned NURBS point locus matches
                   //            the surfaces's to the desired accuracy but, on
                   //            the interior of the surface's domain, the 
                   //            surface's parameterization and the NURBS
                   //            parameterization may not match to the 
                   //            desired accuracy.
        ON_NurbsSurface& nurbs,
        double tolerance
        ) const
{
  bool rc = IsValid();

  if( !rc )
  {
    if (    m_plane.origin.x != ON_UNSET_VALUE 
         && m_plane.xaxis.x != ON_UNSET_VALUE 
         && m_plane.yaxis.x != ON_UNSET_VALUE
         && m_domain[0].IsIncreasing() && m_domain[1].IsIncreasing()
         && m_extents[0].Length() > 0.0 && m_extents[1].Length() > 0.0
         )
    {
      ON_3dVector N = ON_CrossProduct(m_plane.xaxis,m_plane.yaxis);
      if ( N.Length() <= 1.0e-4 )
      {
        ON_WARNING("ON_PlaneSurface::GetNurbForm - using invalid surface.");
        rc = true;
      }
    }
  }

  if ( rc ) 
  {
    nurbs.m_dim = 3;
    nurbs.m_is_rat = 0;
    nurbs.m_order[0] = nurbs.m_order[1] = 2;
    nurbs.m_cv_count[0] = nurbs.m_cv_count[1] = 2;
    nurbs.m_cv_stride[1] = nurbs.m_dim;
    nurbs.m_cv_stride[0] = nurbs.m_cv_stride[1]*nurbs.m_cv_count[1];
    nurbs.ReserveCVCapacity(12);
    nurbs.ReserveKnotCapacity(0,2);
    nurbs.ReserveKnotCapacity(1,2);
    nurbs.m_knot[0][0] = m_domain[0][0];
    nurbs.m_knot[0][1] = m_domain[0][1];
    nurbs.m_knot[1][0] = m_domain[1][0];
    nurbs.m_knot[1][1] = m_domain[1][1];
    nurbs.SetCV( 0, 0, PointAt( m_domain[0][0], m_domain[1][0] ));
    nurbs.SetCV( 0, 1, PointAt( m_domain[0][0], m_domain[1][1] ));
    nurbs.SetCV( 1, 0, PointAt( m_domain[0][1], m_domain[1][0] ));
    nurbs.SetCV( 1, 1, PointAt( m_domain[0][1], m_domain[1][1] ));
  }

  return rc;
}